

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int clearCellOverflow(MemPage *pPage,uchar *pCell,CellInfo *pInfo)

{
  int iVar1;
  Pgno PVar2;
  MemPage *local_50;
  MemPage *pOvfl;
  uint local_40;
  Pgno iNext;
  u32 ovflPageSize;
  int nOvfl;
  int rc;
  Pgno ovflPgno;
  BtShared *pBt;
  CellInfo *pInfo_local;
  uchar *pCell_local;
  MemPage *pPage_local;
  
  pBt = (BtShared *)pInfo;
  pInfo_local = (CellInfo *)pCell;
  pCell_local = &pPage->isInit;
  if (pPage->aDataEnd < pCell + (int)(uint)pInfo->nSize) {
    pPage_local._4_4_ = sqlite3CorruptError(0x1242c);
  }
  else {
    nOvfl = sqlite3Get4byte(pCell + (long)(int)(uint)pInfo->nSize + -4);
    _rc = *(BtShared **)(pCell_local + 0x48);
    local_40 = _rc->usableSize - 4;
    iNext = (((*(int *)&pBt->pCursor - (uint)*(ushort *)((long)&pBt->pCursor + 4)) + local_40) - 1)
            / local_40;
    while (iVar1 = nOvfl, PVar2 = iNext - 1, iNext != 0) {
      pOvfl._4_4_ = 0;
      local_50 = (MemPage *)0x0;
      iNext = PVar2;
      if (((uint)nOvfl < 2) || (PVar2 = btreePagecount(_rc), PVar2 < (uint)iVar1)) {
        iVar1 = sqlite3CorruptError(0x1243d);
        return iVar1;
      }
      if (iNext != 0) {
        iVar1 = getOverflowPage(_rc,nOvfl,&local_50,(Pgno *)((long)&pOvfl + 4));
        if (iVar1 != 0) {
          return iVar1;
        }
        ovflPageSize = 0;
      }
      if (((local_50 == (MemPage *)0x0) &&
          (local_50 = btreePageLookup(_rc,nOvfl), local_50 == (MemPage *)0x0)) ||
         (iVar1 = sqlite3PagerPageRefcount(local_50->pDbPage), iVar1 == 1)) {
        ovflPageSize = freePage2(_rc,local_50,nOvfl);
      }
      else {
        ovflPageSize = sqlite3CorruptError(0x12451);
      }
      if (local_50 != (MemPage *)0x0) {
        sqlite3PagerUnref(local_50->pDbPage);
      }
      if (ovflPageSize != 0) {
        return ovflPageSize;
      }
      nOvfl = pOvfl._4_4_;
    }
    pPage_local._4_4_ = 0;
  }
  return pPage_local._4_4_;
}

Assistant:

static SQLITE_NOINLINE int clearCellOverflow(
  MemPage *pPage,          /* The page that contains the Cell */
  unsigned char *pCell,    /* First byte of the Cell */
  CellInfo *pInfo          /* Size information about the cell */
){
  BtShared *pBt;
  Pgno ovflPgno;
  int rc;
  int nOvfl;
  u32 ovflPageSize;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pInfo->nLocal!=pInfo->nPayload );
  testcase( pCell + pInfo->nSize == pPage->aDataEnd );
  testcase( pCell + (pInfo->nSize-1) == pPage->aDataEnd );
  if( pCell + pInfo->nSize > pPage->aDataEnd ){
    /* Cell extends past end of page */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  ovflPgno = get4byte(pCell + pInfo->nSize - 4);
  pBt = pPage->pBt;
  assert( pBt->usableSize > 4 );
  ovflPageSize = pBt->usableSize - 4;
  nOvfl = (pInfo->nPayload - pInfo->nLocal + ovflPageSize - 1)/ovflPageSize;
  assert( nOvfl>0 ||
    (CORRUPT_DB && (pInfo->nPayload + ovflPageSize)<ovflPageSize)
  );
  while( nOvfl-- ){
    Pgno iNext = 0;
    MemPage *pOvfl = 0;
    if( ovflPgno<2 || ovflPgno>btreePagecount(pBt) ){
      /* 0 is not a legal page number and page 1 cannot be an
      ** overflow page. Therefore if ovflPgno<2 or past the end of the
      ** file the database must be corrupt. */
      return SQLITE_CORRUPT_BKPT;
    }
    if( nOvfl ){
      rc = getOverflowPage(pBt, ovflPgno, &pOvfl, &iNext);
      if( rc ) return rc;
    }

    if( ( pOvfl || ((pOvfl = btreePageLookup(pBt, ovflPgno))!=0) )
     && sqlite3PagerPageRefcount(pOvfl->pDbPage)!=1
    ){
      /* There is no reason any cursor should have an outstanding reference
      ** to an overflow page belonging to a cell that is being deleted/updated.
      ** So if there exists more than one reference to this page, then it
      ** must not really be an overflow page and the database must be corrupt.
      ** It is helpful to detect this before calling freePage2(), as
      ** freePage2() may zero the page contents if secure-delete mode is
      ** enabled. If this 'overflow' page happens to be a page that the
      ** caller is iterating through or using in some other way, this
      ** can be problematic.
      */
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = freePage2(pBt, pOvfl, ovflPgno);
    }

    if( pOvfl ){
      sqlite3PagerUnref(pOvfl->pDbPage);
    }
    if( rc ) return rc;
    ovflPgno = iNext;
  }
  return SQLITE_OK;
}